

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.h
# Opt level: O3

bool __thiscall Initialize::CreateFiles(Initialize *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pbVar3;
  char cVar4;
  Tools *pTVar5;
  long *plVar6;
  Logger *pLVar7;
  undefined8 uVar8;
  size_type *psVar9;
  long lVar10;
  bool bVar11;
  pointer pcVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  ofstream newFile;
  ifstream file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  long *local_498 [2];
  long local_488 [2];
  string local_478;
  string local_458;
  long local_438;
  filebuf local_430 [240];
  ios_base local_340 [264];
  string local_238 [520];
  
  std::ofstream::ofstream(&local_438);
  std::ifstream::ifstream(local_238);
  lVar10 = 8;
  paVar1 = &local_4b8.field_2;
  pcVar12 = (pointer)0x0;
  while( true ) {
    pTVar5 = Tools::getInstance();
    if ((pointer)((long)(pTVar5->fileNames->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pTVar5->fileNames->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= pcVar12) break;
    local_498[0] = local_488;
    pcVar2 = (this->path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_498,pcVar2,pcVar2 + (this->path)._M_string_length);
    std::__cxx11::string::append((char *)local_498);
    pTVar5 = Tools::getInstance();
    pbVar3 = (pTVar5->fileNames->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((pointer)((long)(pTVar5->fileNames->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <= pcVar12)
    {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",pcVar12
                );
      goto LAB_00105884;
    }
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_498,*(ulong *)((long)pbVar3 + lVar10 + -8));
    psVar9 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_4b8.field_2._M_allocated_capacity = *psVar9;
      local_4b8.field_2._8_8_ = plVar6[3];
      local_4b8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_4b8.field_2._M_allocated_capacity = *psVar9;
      local_4b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_4b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::ofstream::open((string *)&local_438,(_Ios_Openmode)&local_4b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
    }
    if (local_498[0] != local_488) {
      operator_delete(local_498[0],local_488[0] + 1);
    }
    std::ofstream::close();
    pcVar12 = pcVar12 + 1;
    lVar10 = lVar10 + 0x20;
  }
  bVar11 = true;
  lVar10 = 0;
  pcVar12 = (pointer)0x0;
  do {
    pTVar5 = Tools::getInstance();
    if ((pointer)((long)(pTVar5->fileNames->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(pTVar5->fileNames->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) <= pcVar12) {
      if (bVar11) {
        pLVar7 = Logger::getInstance();
        local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_458,"All files created successfully","");
        Logger::LogInformation(pLVar7,&local_458);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
        }
      }
      std::ifstream::~ifstream(local_238);
      local_438 = _VTT;
      *(undefined8 *)(local_430 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
      std::filebuf::~filebuf(local_430);
      std::ios_base::~ios_base(local_340);
      return bVar11;
    }
    local_498[0] = local_488;
    pcVar2 = (this->path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_498,pcVar2,pcVar2 + (this->path)._M_string_length);
    std::__cxx11::string::append((char *)local_498);
    pTVar5 = Tools::getInstance();
    pbVar3 = (pTVar5->fileNames->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((pointer)((long)(pTVar5->fileNames->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <= pcVar12)
    break;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_498,
                                *(ulong *)((long)&(pbVar3->_M_dataplus)._M_p + lVar10));
    psVar9 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_4b8.field_2._M_allocated_capacity = *psVar9;
      local_4b8.field_2._8_8_ = plVar6[3];
      local_4b8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_4b8.field_2._M_allocated_capacity = *psVar9;
      local_4b8._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_4b8._M_string_length = plVar6[1];
    *plVar6 = (long)psVar9;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::ifstream::open(local_238,(_Ios_Openmode)&local_4b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
    }
    if (local_498[0] != local_488) {
      operator_delete(local_498[0],local_488[0] + 1);
    }
    cVar4 = std::__basic_file<char>::is_open();
    if (cVar4 == '\0') {
      pLVar7 = Logger::getInstance();
      pTVar5 = Tools::getInstance();
      pbVar3 = (pTVar5->fileNames->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if ((pointer)((long)(pTVar5->fileNames->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >> 5) <=
          pcVar12) goto LAB_00105895;
      std::operator+(&local_4b8,"File - ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(pbVar3->_M_dataplus)._M_p + lVar10));
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_4b8);
      local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
      psVar9 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_478.field_2._M_allocated_capacity = *psVar9;
        local_478.field_2._8_8_ = plVar6[3];
      }
      else {
        local_478.field_2._M_allocated_capacity = *psVar9;
        local_478._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_478._M_string_length = plVar6[1];
      *plVar6 = (long)psVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      Logger::LogError(pLVar7,&local_478);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_dataplus._M_p != &local_478.field_2) {
        operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
      }
      bVar11 = false;
    }
    std::ifstream::close();
    pcVar12 = pcVar12 + 1;
    lVar10 = lVar10 + 0x20;
  } while( true );
LAB_00105884:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",pcVar12);
LAB_00105895:
  uVar8 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     pcVar12);
  if (local_458._M_dataplus._M_p != pcVar12) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(local_238);
  std::ofstream::~ofstream(&local_438);
  _Unwind_Resume(uVar8);
}

Assistant:

bool CreateFiles() {
        ofstream newFile;
        ifstream file;
        bool isCreated = true;

        for (int i = 0; i < Tools::getInstance()->fileNames->size(); i++) {
            newFile.open(this->path + "/" + Tools::getInstance()->fileNames->at(i));
            newFile.close();
        }

        for (int i = 0; i < Tools::getInstance()->fileNames->size(); i++) {
            file.open(this->path + "/" + Tools::getInstance()->fileNames->at(i));
            if (!file.is_open()) {
                Logger::getInstance()->LogError("File - " + Tools::getInstance()->fileNames->at(i) + "didn't create");
                isCreated = false;
            }

            file.close();
        }

        if (isCreated) {
            Logger::getInstance()->LogInformation("All files created successfully");
        }

        return isCreated;
    }